

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_CopyFromPacked_Test::TestBody
          (ExtensionSetTest_CopyFromPacked_Test *this)

{
  undefined1 local_70 [8];
  TestPackedExtensions message2;
  TestPackedExtensions message1;
  ExtensionSetTest_CopyFromPacked_Test *this_local;
  
  proto2_unittest::TestPackedExtensions::TestPackedExtensions
            ((TestPackedExtensions *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestPackedExtensions::TestPackedExtensions((TestPackedExtensions *)local_70);
  TestUtil::SetPackedExtensions<proto2_unittest::TestPackedExtensions>
            ((TestPackedExtensions *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestPackedExtensions::CopyFrom
            ((TestPackedExtensions *)local_70,
             (TestPackedExtensions *)&message2.field_0._impl_._cached_size_);
  TestUtil::ExpectPackedExtensionsSet<proto2_unittest::TestPackedExtensions>
            ((TestPackedExtensions *)local_70);
  proto2_unittest::TestPackedExtensions::CopyFrom
            ((TestPackedExtensions *)local_70,
             (TestPackedExtensions *)&message2.field_0._impl_._cached_size_);
  TestUtil::ExpectPackedExtensionsSet<proto2_unittest::TestPackedExtensions>
            ((TestPackedExtensions *)local_70);
  proto2_unittest::TestPackedExtensions::~TestPackedExtensions((TestPackedExtensions *)local_70);
  proto2_unittest::TestPackedExtensions::~TestPackedExtensions
            ((TestPackedExtensions *)&message2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST(ExtensionSetTest, CopyFromPacked) {
  unittest::TestPackedExtensions message1, message2;

  TestUtil::SetPackedExtensions(&message1);
  message2.CopyFrom(message1);
  TestUtil::ExpectPackedExtensionsSet(message2);
  message2.CopyFrom(message1);  // exercise copy when fields already exist
  TestUtil::ExpectPackedExtensionsSet(message2);
}